

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_test.c
# Opt level: O3

void test_wait_n_ready_while_queuing(testing t)

{
  int iVar1;
  nsync_note pnVar2;
  char *pcVar3;
  __syscall_slong_t in_RCX;
  long *plVar4;
  long lVar5;
  nsync_time abs_deadline;
  nsync_time abs_deadline_00;
  nsync_waitable_s *pw [2];
  nsync_waitable_s w [2];
  nsync_waitable_funcs_s wrapped_note_waitable_funcs;
  nsync_waitable_s **in_stack_ffffffffffffff80;
  long local_78 [6];
  code *local_48;
  code *pcStack_40;
  code *local_38;
  
  pcStack_40 = nsync::note_enqueue;
  local_38 = nsync::note_dequeue;
  local_48 = note_ready_time_wrapper;
  plVar4 = local_78;
  lVar5 = 0;
  do {
    plVar4 = plVar4 + 2;
    abs_deadline.tv_nsec = in_RCX;
    abs_deadline.tv_sec = 999999999;
    pnVar2 = nsync::nsync_note_new((nsync *)0x0,(nsync_note)0x7fffffffffffffff,abs_deadline);
    iVar1 = nsync::nsync_note_is_notified(pnVar2);
    if (iVar1 != 0) {
      pcVar3 = smprintf("nsync_note is unexpectedly notified");
      in_RCX = 0xa0;
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/wait_test.c"
                     ,0xa0,pcVar3);
    }
    *plVar4 = (long)pnVar2;
    plVar4[1] = (long)&local_48;
    local_78[lVar5] = (long)plVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  abs_deadline_00.tv_nsec = 2;
  abs_deadline_00.tv_sec = 999999999;
  iVar1 = nsync::nsync_wait_n((nsync *)0x0,(void *)0x0,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x7fffffffffffffff,abs_deadline_00,
                              (int)local_78,in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    pcVar3 = smprintf("nsync_wait_n unexpectedly failed to find pw[0] notified");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/wait_test.c"
                   ,0xa9,pcVar3);
  }
  lVar5 = 0;
  do {
    pnVar2 = *(nsync_note *)((long)local_78 + lVar5 + 0x10);
    iVar1 = nsync::nsync_note_is_notified(pnVar2);
    if (iVar1 == 0) {
      pcVar3 = smprintf("nsync_note is unexpectedly not notified");
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/wait_test.c"
                     ,0xae,pcVar3);
    }
    nsync::nsync_note_free(pnVar2);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x20);
  return;
}

Assistant:

static void test_wait_n_ready_while_queuing (testing t) {
	struct nsync_waitable_s w[2];
	struct nsync_waitable_s *pw[2];
	int count;
	int woken;

        /* This test works by wrapping nsync_note's *ready_time function so
           that the note is notified just after nsync_wait_n() checks that it
           if not notified on entry.  */
	struct nsync_waitable_funcs_s wrapped_note_waitable_funcs;
	wrapped_note_waitable_funcs = nsync_note_waitable_funcs;
	wrapped_note_waitable_funcs.ready_time = &note_ready_time_wrapper;

	for (count = 0; count != sizeof (w) / sizeof (w[0]); count++) {
		nsync_note n = nsync_note_new (NULL, nsync_time_no_deadline);
		if (nsync_note_is_notified (n)) {
			TEST_ERROR (t, ("nsync_note is unexpectedly notified"));
		}
		w[count].v = n;
		w[count].funcs = &wrapped_note_waitable_funcs;
		pw[count] = &w[count];
	}
	woken = nsync_wait_n (NULL, NULL, NULL, nsync_time_no_deadline,
			      count, pw);
	if (woken != 0) {
		TEST_ERROR (t, ("nsync_wait_n unexpectedly failed to find pw[0] notified"));
	}
	for (count = 0; count != sizeof (w) / sizeof (w[0]); count++) {
		nsync_note n = (nsync_note) w[count].v;
		if (!nsync_note_is_notified (n)) {
			TEST_ERROR (t, ("nsync_note is unexpectedly not notified"));
		}
		nsync_note_free (n);
	}
}